

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O0

int yyparse_from(GREG *G,yyrule yystart)

{
  int iVar1;
  char *pcVar2;
  yythunk *pyVar3;
  int *piVar4;
  int yyok;
  yyrule yystart_local;
  GREG *G_local;
  
  if (G->buflen == 0) {
    G->buflen = 0x400;
    pcVar2 = (char *)malloc((long)G->buflen);
    G->buf = pcVar2;
    G->textlen = 0x400;
    pcVar2 = (char *)malloc((long)G->textlen);
    G->text = pcVar2;
    G->thunkslen = 0x80;
    pyVar3 = (yythunk *)malloc((long)G->thunkslen << 5);
    G->thunks = pyVar3;
    G->valslen = 0x80;
    piVar4 = (int *)malloc((long)G->valslen << 2);
    G->vals = piVar4;
    G->thunkpos = 0;
    G->limit = 0;
    G->pos = 0;
    G->end = 0;
    G->begin = 0;
  }
  G->pos = 0;
  G->end = G->pos;
  G->begin = G->pos;
  G->thunkpos = 0;
  G->val = G->vals;
  iVar1 = (*yystart)(G);
  if (iVar1 != 0) {
    yyDone(G);
  }
  yyCommit(G);
  return iVar1;
}

Assistant:

YY_PARSE(int) YY_NAME(parse_from)(GREG *G, yyrule yystart)
{
  int yyok;
  if (!G->buflen)
    {
      G->buflen= YY_BUFFER_START_SIZE;
      G->buf= (char*)YY_ALLOC(G->buflen, G->data);
      G->textlen= YY_BUFFER_START_SIZE;
      G->text= (char*)YY_ALLOC(G->textlen, G->data);
      G->thunkslen= YY_STACK_SIZE;
      G->thunks= (yythunk*)YY_ALLOC(sizeof(yythunk) * G->thunkslen, G->data);
      G->valslen= YY_STACK_SIZE;
      G->vals= (YYSTYPE*)YY_ALLOC(sizeof(YYSTYPE) * G->valslen, G->data);
      G->begin= G->end= G->pos= G->limit= G->thunkpos= 0;
    }
  G->pos = 0;
  G->begin= G->end= G->pos;
  G->thunkpos= 0;
  G->val= G->vals;
  yyok= yystart(G);
  if (yyok) yyDone(G);
  yyCommit(G);
  return yyok;
  (void)yyrefill;
  (void)yymatchDot;
  (void)yymatchChar;
  (void)yymatchString;
  (void)yymatchClass;
  (void)yyDo;
  (void)yyText;
  (void)yyDone;
  (void)yyCommit;
  (void)yyAccept;
  (void)yyPush;
  (void)yyPop;
  (void)yySet;
}